

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

void __thiscall
SQLexer::Init(SQLexer *this,SQSharedState *ss,char *sourceText,size_t sourceTextSize)

{
  SQTable *pSVar1;
  SQString *pSVar2;
  size_t in_RCX;
  char *in_RDX;
  SQSharedState *in_RSI;
  SQLexer *in_RDI;
  SQInteger in_stack_fffffffffffff9a8;
  SQSharedState *in_stack_fffffffffffff9b0;
  SQTable *this_00;
  SQChar *in_stack_fffffffffffff9b8;
  SQTable *s;
  SQSharedState *in_stack_fffffffffffff9c0;
  SQSharedState *ss_00;
  SQTable *this_01;
  SQObjectPtr *in_stack_fffffffffffff9e8;
  SQTable *val;
  SQObjectPtr *in_stack_fffffffffffff9f0;
  SQTable *key;
  SQTable *in_stack_fffffffffffff9f8;
  SQObjectPtr local_510;
  SQObjectPtr local_500;
  SQObjectPtr local_4f0;
  SQObjectPtr local_4e0;
  SQObjectPtr local_4d0;
  SQObjectPtr local_4c0;
  SQObjectPtr local_4b0;
  SQObjectPtr local_4a0;
  SQObjectPtr local_490;
  SQObjectPtr local_480;
  SQObjectPtr local_470;
  SQObjectPtr local_460;
  SQObjectPtr local_450;
  SQObjectPtr local_440;
  SQObjectPtr local_430;
  SQObjectPtr local_420;
  SQObjectPtr local_410;
  SQObjectPtr local_400;
  SQObjectPtr local_3f0;
  SQObjectPtr local_3e0;
  SQObjectPtr local_3d0;
  SQObjectPtr local_3c0;
  SQObjectPtr local_3b0;
  SQObjectPtr local_3a0;
  SQObjectPtr local_390;
  SQObjectPtr local_380;
  SQObjectPtr local_370;
  SQObjectPtr local_360;
  SQObjectPtr local_350;
  SQObjectPtr local_340;
  SQObjectPtr local_330;
  SQObjectPtr local_320;
  SQObjectPtr local_310;
  SQObjectPtr local_300;
  SQObjectPtr local_2f0;
  SQObjectPtr local_2e0;
  SQObjectPtr local_2d0;
  SQObjectPtr local_2c0;
  SQObjectPtr local_2b0;
  SQObjectPtr local_2a0;
  SQObjectPtr local_290;
  SQObjectPtr local_280;
  SQObjectPtr local_270;
  SQObjectPtr local_260;
  SQObjectPtr local_250;
  SQObjectPtr local_240;
  SQObjectPtr local_230;
  SQObjectPtr local_220;
  SQObjectPtr local_210;
  SQObjectPtr local_200;
  SQObjectPtr local_1f0;
  SQObjectPtr local_1e0;
  SQObjectPtr local_1d0;
  SQObjectPtr local_1c0;
  SQObjectPtr local_1b0;
  SQObjectPtr local_1a0;
  SQObjectPtr local_190;
  SQObjectPtr local_180;
  SQObjectPtr local_170;
  SQObjectPtr local_160;
  SQObjectPtr local_150;
  SQObjectPtr local_140;
  SQObjectPtr local_130;
  SQObjectPtr local_120;
  SQObjectPtr local_110;
  SQObjectPtr local_100;
  SQObjectPtr local_f0;
  SQObjectPtr local_e0;
  SQObjectPtr local_d0;
  SQObjectPtr local_c0;
  SQObjectPtr local_b0;
  SQObjectPtr local_a0;
  SQObjectPtr local_90;
  SQObjectPtr local_80;
  SQObjectPtr local_70;
  SQObjectPtr local_60 [2];
  SQObjectPtr local_40;
  SQObjectPtr local_30;
  size_t local_20;
  char *local_18;
  
  in_RDI->_sharedstate = in_RSI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  pSVar1 = SQTable::Create(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  in_RDI->_keywords = pSVar1;
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_30,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_40,0x112);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(local_60,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_70,0x115);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_80,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_90,0x110);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_a0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_b0,0x111);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_c0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_d0,0x113);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_e0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_f0,0x123);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_100,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_110,0x11e);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_120,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_130,0x116);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_140,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_150,0x11d);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_160,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_170,0x11b);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_180,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_190,0x114);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_1a0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_1b0,0x117);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_1c0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_1d0,0x118);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_1e0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_1f0,0x11f);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_200,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_210,0x106);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_220,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_230,0x107);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_240,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_250,0x125);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_260,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_270,0x126);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_280,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_290,0x127);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_2a0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_2b0,0x11c);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_2c0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_2d0,0x124);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_2e0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_2f0,0x12a);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_300,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_310,0x10c);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_320,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_330,300);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_340,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_350,0x12d);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_360,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_370,0x12e);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_380,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_390,0x133);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_3a0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_3b0,0x136);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_3c0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_3d0,0x137);
  SQTable::NewSlot(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar1 = in_RDI->_keywords;
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_3e0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_3f0,0x13b);
  SQTable::NewSlot(pSVar1,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  key = in_RDI->_keywords;
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_400,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_410,0x13c);
  SQTable::NewSlot(pSVar1,(SQObjectPtr *)key,in_stack_fffffffffffff9e8);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  val = in_RDI->_keywords;
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_420,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_430,0x142);
  SQTable::NewSlot(pSVar1,(SQObjectPtr *)key,(SQObjectPtr *)val);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  this_01 = in_RDI->_keywords;
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_440,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_450,0x143);
  SQTable::NewSlot(pSVar1,(SQObjectPtr *)key,(SQObjectPtr *)val);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_460,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_470,0x144);
  SQTable::NewSlot(pSVar1,(SQObjectPtr *)key,(SQObjectPtr *)val);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_480,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_490,0x139);
  SQTable::NewSlot(pSVar1,(SQObjectPtr *)key,(SQObjectPtr *)val);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  pSVar2 = SQString::Create(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                            (SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_4a0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_4b0,0x13a);
  SQTable::NewSlot(pSVar1,(SQObjectPtr *)key,(SQObjectPtr *)val);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ss_00 = (SQSharedState *)in_RDI->_keywords;
  pSVar2 = SQString::Create(ss_00,in_stack_fffffffffffff9b8,(SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_4c0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_4d0,0x14b);
  SQTable::NewSlot(pSVar1,(SQObjectPtr *)key,(SQObjectPtr *)val);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  s = in_RDI->_keywords;
  pSVar2 = SQString::Create(ss_00,(SQChar *)s,(SQInteger)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::SQObjectPtr(&local_4e0,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_4f0,0x14e);
  SQTable::NewSlot(pSVar1,(SQObjectPtr *)key,(SQObjectPtr *)val);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffff9b0);
  this_00 = in_RDI->_keywords;
  pSVar2 = SQString::Create(ss_00,(SQChar *)s,(SQInteger)this_00);
  ::SQObjectPtr::SQObjectPtr(&local_500,pSVar2);
  ::SQObjectPtr::SQObjectPtr(&local_510,0x150);
  SQTable::NewSlot(pSVar1,(SQObjectPtr *)key,(SQObjectPtr *)val);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
  in_RDI->_sourceText = local_18;
  in_RDI->_sourceTextSize = local_20;
  in_RDI->_sourceTextPtr = 0;
  in_RDI->_currentline = 1;
  in_RDI->_lasttokenline = 1;
  in_RDI->_currentcolumn = 0;
  in_RDI->_lasttokencolumn = 0;
  in_RDI->_prevtoken = -1;
  in_RDI->_tokencolumn = 0;
  in_RDI->_tokenline = 1;
  in_RDI->_reached_eof = 0;
  if (in_RDI->_comments != (Comments *)0x0) {
    SQCompilation::Comments::pushNewLine((Comments *)this_01);
  }
  Next(in_RDI);
  return;
}

Assistant:

void SQLexer::Init(SQSharedState *ss, const char *sourceText, size_t sourceTextSize)
{
    _sharedstate = ss;
    _keywords = SQTable::Create(ss, 38);
    ADD_KEYWORD(while, TK_WHILE);
    ADD_KEYWORD(do, TK_DO);
    ADD_KEYWORD(if, TK_IF);
    ADD_KEYWORD(else, TK_ELSE);
    ADD_KEYWORD(break, TK_BREAK);
    ADD_KEYWORD(continue, TK_CONTINUE);
    ADD_KEYWORD(return, TK_RETURN);
    ADD_KEYWORD(null, TK_NULL);
    ADD_KEYWORD(function, TK_FUNCTION);
    ADD_KEYWORD(local, TK_LOCAL);
    ADD_KEYWORD(for, TK_FOR);
    ADD_KEYWORD(foreach, TK_FOREACH);
    ADD_KEYWORD(in, TK_IN);
    ADD_KEYWORD(typeof, TK_TYPEOF);
    ADD_KEYWORD(base, TK_BASE);
    ADD_KEYWORD(delete, TK_DELETE);
    ADD_KEYWORD(try, TK_TRY);
    ADD_KEYWORD(catch, TK_CATCH);
    ADD_KEYWORD(throw, TK_THROW);
    ADD_KEYWORD(clone, TK_CLONE);
    ADD_KEYWORD(yield, TK_YIELD);
    ADD_KEYWORD(resume, TK_RESUME);
    ADD_KEYWORD(switch, TK_SWITCH);
    ADD_KEYWORD(case, TK_CASE);
    ADD_KEYWORD(default, TK_DEFAULT);
    ADD_KEYWORD(this, TK_THIS);
    ADD_KEYWORD(class,TK_CLASS);
    ADD_KEYWORD(constructor,TK_CONSTRUCTOR);
    ADD_KEYWORD(instanceof,TK_INSTANCEOF);
    ADD_KEYWORD(true,TK_TRUE);
    ADD_KEYWORD(false,TK_FALSE);
    ADD_KEYWORD(static,TK_STATIC);
    ADD_KEYWORD(enum,TK_ENUM);
    ADD_KEYWORD(const,TK_CONST);
    ADD_KEYWORD(__LINE__,TK___LINE__);
    ADD_KEYWORD(__FILE__,TK___FILE__);
    ADD_KEYWORD(global, TK_GLOBAL);
    ADD_KEYWORD(not, TK_NOT);
    ADD_KEYWORD(let, TK_LET);


    _sourceText = sourceText;
    _sourceTextSize = sourceTextSize;
    _sourceTextPtr = 0;
    _lasttokenline = _currentline = 1;
    _lasttokencolumn = _currentcolumn = 0;
    _prevtoken = -1;
    _tokencolumn = 0;
    _tokenline = 1;
    _reached_eof = SQFalse;
    if (_comments)
      _comments->pushNewLine();
    Next();
}